

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

iter_type __thiscall
booster::locale::impl_icu::num_parse<char>::do_real_get<long_long>
          (num_parse<char> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,longlong *val
          )

{
  iter_type iVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  ulong uVar8;
  streambuf_type *psVar9;
  ulong uVar10;
  uint uVar11;
  iter_type __beg;
  iter_type iVar12;
  iter_type iVar13;
  string_type tmp;
  cast_type value;
  
  iVar12._M_sbuf = end._M_sbuf;
  psVar9 = in._M_sbuf;
  uVar11 = in._M_c;
  plVar7 = (long *)__dynamic_cast(ios,&std::ios_base::typeinfo,&std::istream::typeinfo,
                                  0xffffffffffffffff);
  iVar6 = end._M_c;
  if (((plVar7 == (long *)0x0) || (bVar3 = num_base::use_parent<long_long>(ios,0), bVar3)) ||
     (formatter<char>::create((formatter<char> *)&tmp,ios,&this->loc_,&this->enc_),
     _Var2 = tmp._M_dataplus, tmp._M_dataplus._M_p == (pointer)0x0)) {
    __beg._12_4_ = 0;
    __beg._M_sbuf = (streambuf_type *)SUB128(in._0_12_,0);
    __beg._M_c = SUB124(in._0_12_,8);
    iVar12._8_8_ = end._8_8_ & 0xffffffff;
    iVar12 = std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::
             _M_extract_int_abi_cxx11_<long_long>
                       ((num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>> *)this,
                        __beg,iVar12,ios,err,val);
    iVar13._M_sbuf = iVar12._M_sbuf;
    iVar13._M_c = iVar12._M_c;
    iVar13._12_4_ = iVar12._12_4_;
    return iVar13;
  }
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  std::__cxx11::string::reserve((ulong)&tmp);
LAB_0018da40:
  uVar4 = uVar11;
  if (uVar11 == 0xffffffff && psVar9 != (streambuf_type *)0x0) {
    if (*(byte **)(psVar9 + 0x10) < *(byte **)(psVar9 + 0x18)) {
      uVar4 = (uint)**(byte **)(psVar9 + 0x10);
    }
    else {
      uVar4 = (**(code **)(*(long *)psVar9 + 0x48))(psVar9);
      if (uVar4 == 0xffffffff) {
        psVar9 = (streambuf_type *)0x0;
      }
    }
  }
  if (iVar12._M_sbuf == (streambuf_type *)0x0 || iVar6 != -1) {
    if ((iVar6 == -1) == (uVar4 == 0xffffffff)) goto LAB_0018dcd5;
  }
  else if ((*(ulong *)(iVar12._M_sbuf + 0x10) < *(ulong *)(iVar12._M_sbuf + 0x18)) ||
          (iVar5 = (**(code **)(*(long *)iVar12._M_sbuf + 0x48))(iVar12._M_sbuf), iVar5 != -1)) {
    if (uVar4 != 0xffffffff) goto LAB_0018dcd5;
  }
  else {
    iVar12._M_sbuf = (streambuf_type *)0x0;
    if (uVar4 == 0xffffffff) goto LAB_0018dcd5;
  }
  uVar4 = uVar11;
  if (psVar9 != (streambuf_type *)0x0 && uVar11 == 0xffffffff) {
    if (*(byte **)(psVar9 + 0x10) < *(byte **)(psVar9 + 0x18)) {
      uVar4 = (uint)**(byte **)(psVar9 + 0x10);
    }
    else {
      uVar4 = (**(code **)(*(long *)psVar9 + 0x48))(psVar9);
      if (uVar4 == 0xffffffff) {
        psVar9 = (streambuf_type *)0x0;
      }
    }
  }
  if ((char)uVar4 != '\x7f' && 0x1f < (byte)((char)uVar4 - 1U)) goto LAB_0018dcd5;
  if (*(ulong *)(psVar9 + 0x10) < *(ulong *)(psVar9 + 0x18)) {
    *(ulong *)(psVar9 + 0x10) = *(ulong *)(psVar9 + 0x10) + 1;
    uVar11 = 0xffffffff;
  }
  else {
    uVar11 = 0xffffffff;
    (**(code **)(*(long *)psVar9 + 0x50))(psVar9);
  }
  goto LAB_0018da40;
LAB_0018dcd5:
  if (0xfff < tmp._M_string_length) goto LAB_0018dce4;
  uVar4 = uVar11;
  if (uVar11 == 0xffffffff && psVar9 != (streambuf_type *)0x0) {
    if (*(byte **)(psVar9 + 0x10) < *(byte **)(psVar9 + 0x18)) {
      uVar4 = (uint)**(byte **)(psVar9 + 0x10);
    }
    else {
      uVar4 = (**(code **)(*(long *)psVar9 + 0x48))(psVar9);
      if (uVar4 == 0xffffffff) {
        psVar9 = (streambuf_type *)0x0;
      }
    }
  }
  if (iVar12._M_sbuf == (streambuf_type *)0x0 || iVar6 != -1) {
    if ((iVar6 == -1) == (uVar4 == 0xffffffff)) goto LAB_0018dce4;
  }
  else if ((*(ulong *)(iVar12._M_sbuf + 0x10) < *(ulong *)(iVar12._M_sbuf + 0x18)) ||
          (iVar5 = (**(code **)(*(long *)iVar12._M_sbuf + 0x48))(iVar12._M_sbuf), iVar5 != -1)) {
    if (uVar4 != 0xffffffff) goto LAB_0018dce4;
  }
  else {
    iVar12._M_sbuf = (streambuf_type *)0x0;
    if (uVar4 == 0xffffffff) goto LAB_0018dce4;
  }
  if (psVar9 == (streambuf_type *)0x0 || uVar11 != 0xffffffff) {
LAB_0018dc0f:
    if ((char)uVar11 == '\n') goto LAB_0018dce4;
  }
  else {
    if (*(byte **)(psVar9 + 0x10) < *(byte **)(psVar9 + 0x18)) {
      uVar11 = (uint)**(byte **)(psVar9 + 0x10);
      goto LAB_0018dc0f;
    }
    uVar11 = (**(code **)(*(long *)psVar9 + 0x48))(psVar9);
    if (uVar11 != 0xffffffff) goto LAB_0018dc0f;
    psVar9 = (streambuf_type *)0x0;
  }
  if (*(ulong *)(psVar9 + 0x10) < *(ulong *)(psVar9 + 0x18)) {
    *(ulong *)(psVar9 + 0x10) = *(ulong *)(psVar9 + 0x10) + 1;
  }
  else {
    iVar5 = (**(code **)(*(long *)psVar9 + 0x50))(psVar9);
    if ((iVar5 == -1) && (*(ulong *)(psVar9 + 0x18) <= *(ulong *)(psVar9 + 0x10))) {
      (**(code **)(*(long *)psVar9 + 0x48))(psVar9);
    }
  }
  uVar11 = 0xffffffff;
  std::__cxx11::string::push_back((char)&tmp);
  goto LAB_0018dcd5;
LAB_0018dce4:
  uVar8 = (**(code **)(*(long *)_Var2._M_p + 0x30))(_Var2._M_p,&tmp,&value);
  uVar10 = tmp._M_string_length;
  if (uVar8 == 0) {
    *(undefined1 *)err = (char)*err | _S_failbit;
  }
  else {
    *val = value;
  }
  for (; uVar8 < uVar10; uVar10 = uVar10 - 1) {
    std::istream::putback((char)plVar7);
  }
  psVar9 = *(streambuf_type **)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0xe8);
  if (psVar9 == (streambuf_type *)0x0) {
    bVar3 = true;
    psVar9 = (streambuf_type *)0x0;
  }
  else if (*(ulong *)(psVar9 + 0x10) < *(ulong *)(psVar9 + 0x18)) {
    bVar3 = false;
  }
  else {
    iVar5 = (**(code **)(*(long *)psVar9 + 0x48))(psVar9);
    bVar3 = iVar5 == -1;
    if (bVar3) {
      psVar9 = (streambuf_type *)0x0;
    }
  }
  if (iVar12._M_sbuf == (streambuf_type *)0x0 || iVar6 != -1) {
    if ((iVar6 != -1) == bVar3) goto LAB_0018dddb;
  }
  else if (*(ulong *)(iVar12._M_sbuf + 0x10) < *(ulong *)(iVar12._M_sbuf + 0x18)) {
    if (bVar3 != false) goto LAB_0018dddb;
  }
  else {
    iVar6 = (**(code **)(*(long *)iVar12._M_sbuf + 0x48))(iVar12._M_sbuf);
    if (bVar3 != (iVar6 == -1)) goto LAB_0018dddb;
  }
  *(undefined1 *)err = (char)*err | _S_eofbit;
LAB_0018dddb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tmp._M_dataplus._M_p != &tmp.field_2) {
    operator_delete(tmp._M_dataplus._M_p);
  }
  (**(code **)(*(long *)_Var2._M_p + 8))(_Var2._M_p);
  iVar1._8_8_ = 0xffffffff;
  iVar1._M_sbuf = psVar9;
  return iVar1;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }